

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

bool __thiscall Polynom<Complex>::isOrdinal(Polynom<Complex> *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  Complex *a;
  BigInteger local_d0;
  Complex local_b0;
  
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  do {
    uVar2 = (ulong)(this->m).N;
    uVar3 = uVar3 + 1;
    if (uVar2 <= uVar3) break;
    a = (Complex *)
        ((long)&(((this->m).arr)->_re)._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar4);
    Rational::operator_cast_to_BigInteger(&local_d0,(Rational *)a);
    Complex::Complex(&local_b0,&local_d0);
    bVar1 = operator!=(a,&local_b0);
    Complex::~Complex(&local_b0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
    if (bVar1) break;
    Rational::operator_cast_to_BigInteger
              ((BigInteger *)&local_b0,
               (Rational *)
               ((long)&(((this->m).arr)->_re)._numerator.digits.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    BigInteger::BigInteger(&local_d0,0);
    bVar1 = operator<((BigInteger *)&local_b0,&local_d0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
    lVar4 = lVar4 + 0x80;
  } while (!bVar1);
  return uVar2 <= uVar3;
}

Assistant:

bool Polynom<Field>::isOrdinal() const
{
    for(unsigned i = 0; i < m.width(); ++i)
    {
        if(m[0][i] != BigInteger(m[0][i]))
            return false;
        if(BigInteger(m[0][i]) < 0)
            return false;
    }
    return true;
}